

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_errmsg(sqlite3 *db)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  if (db == (sqlite3 *)0x0) {
    pcVar3 = "out of memory";
  }
  else {
    iVar2 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar2 == 0) {
      sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1fa63,
                  "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
      pcVar3 = "library routine called out of sequence";
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        pcVar3 = (char *)sqlite3ValueText(db->pErr,'\x01');
        if (pcVar3 == (char *)0x0) {
          uVar1 = db->errCode;
          if (uVar1 == 0x204) {
            pcVar3 = "abort due to ROLLBACK";
          }
          else if ((ulong)(byte)uVar1 == 2 || 0x1a < (uVar1 & 0xff)) {
            pcVar3 = "unknown error";
          }
          else {
            pcVar3 = *(char **)(sqlite3ErrStr_aMsg + (ulong)(byte)uVar1 * 8);
          }
        }
      }
      else {
        pcVar3 = "out of memory";
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *SQLITE_STDCALL sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM);
  }else{
    testcase( db->pErr==0 );
    z = (char*)sqlite3_value_text(db->pErr);
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}